

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::RestoreRegexStacks(ScriptContext *this,RegexStacks *stacks)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (stacks == (RegexStacks *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x4cf,"(stacks)","stacks");
    if (!bVar2) goto LAB_00791db8;
    *puVar3 = 0;
  }
  if (this->regexStacks == stacks) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x4d0,"(stacks != regexStacks)","stacks != regexStacks");
    if (!bVar2) {
LAB_00791db8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->regexStacks != (RegexStacks *)0x0) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::RegexStacks>
              (&this->regexAllocator,this->regexStacks);
  }
  this->regexStacks = stacks;
  return;
}

Assistant:

void ScriptContext::RestoreRegexStacks(UnifiedRegex::RegexStacks *const stacks)
    {
        Assert(stacks);
        Assert(stacks != regexStacks);

        if (regexStacks)
        {
            Adelete(RegexAllocator(), regexStacks);
        }
        regexStacks = stacks;
    }